

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFab.cpp
# Opt level: O2

Real amrex::MultiFab::Dot
               (MultiFab *x,int xcomp,MultiFab *y,int ycomp,int numcomp,int nghost,bool local)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  int k;
  ulong uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  Real local_1a0;
  Box local_12c;
  Array4<const_double> local_110;
  Array4<const_double> local_d0;
  MFIter mfi;
  
  uVar6 = (ulong)(uint)numcomp;
  MFIter::MFIter(&mfi,(FabArrayBase *)x,true);
  if (numcomp < 1) {
    uVar6 = 0;
  }
  local_1a0 = 0.0;
  while (mfi.currentIndex < mfi.endIndex) {
    MFIter::growntilebox(&local_12c,&mfi,nghost);
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (&local_d0,&x->super_FabArray<amrex::FArrayBox>,&mfi);
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (&local_110,&y->super_FabArray<amrex::FArrayBox>,&mfi);
    lVar1 = (long)local_12c.smallend.vect[0];
    lVar11 = (long)local_12c.smallend.vect[1];
    lVar10 = (long)local_12c.smallend.vect[2];
    lVar7 = (long)xcomp * 8 * local_d0.nstride +
            (lVar11 - local_d0.begin.y) * local_d0.jstride * 8 +
            (lVar10 - local_d0.begin.z) * local_d0.kstride * 8 + lVar1 * 8 +
            (long)local_d0.begin.x * -8 + (long)local_d0.p;
    lVar4 = (long)ycomp * 8 * local_110.nstride +
            (lVar11 - local_110.begin.y) * local_110.jstride * 8 +
            (lVar10 - local_110.begin.z) * local_110.kstride * 8 + lVar1 * 8 +
            (long)local_110.begin.x * -8 + (long)local_110.p;
    for (uVar3 = 0; lVar5 = lVar4, lVar8 = lVar10, lVar12 = lVar7, uVar3 != uVar6; uVar3 = uVar3 + 1
        ) {
      for (; lVar2 = lVar11, lVar9 = lVar12, lVar13 = lVar5, lVar8 <= local_12c.bigend.vect[2];
          lVar8 = lVar8 + 1) {
        for (; lVar2 <= local_12c.bigend.vect[1]; lVar2 = lVar2 + 1) {
          for (lVar14 = 0; lVar1 + lVar14 <= (long)local_12c.bigend.vect[0]; lVar14 = lVar14 + 1) {
            local_1a0 = local_1a0 +
                        *(double *)(lVar9 + lVar14 * 8) * *(double *)(lVar13 + lVar14 * 8);
          }
          lVar9 = lVar9 + local_d0.jstride * 8;
          lVar13 = lVar13 + local_110.jstride * 8;
        }
        lVar5 = lVar5 + local_110.kstride * 8;
        lVar12 = lVar12 + local_d0.kstride * 8;
      }
      lVar7 = lVar7 + local_d0.nstride * 8;
      lVar4 = lVar4 + local_110.nstride * 8;
    }
    MFIter::operator++(&mfi);
  }
  MFIter::~MFIter(&mfi);
  return local_1a0;
}

Assistant:

Real
MultiFab::Dot (const MultiFab& x, int xcomp,
               const MultiFab& y, int ycomp,
               int numcomp, int nghost, bool local)
{
    BL_ASSERT(x.boxArray() == y.boxArray());
    BL_ASSERT(x.DistributionMap() == y.DistributionMap());
    BL_ASSERT(x.nGrow() >= nghost && y.nGrow() >= nghost);

    BL_PROFILE("MultiFab::Dot()");

    Real sm = Real(0.0);
#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion()) {
        auto const& xma = x.const_arrays();
        auto const& yma = y.const_arrays();
        sm = ParReduce(TypeList<ReduceOpSum>{}, TypeList<Real>{}, x, IntVect(nghost),
        [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept -> GpuTuple<Real>
        {
            Real t = Real(0.0);
            auto const& xfab = xma[box_no];
            auto const& yfab = yma[box_no];
            for (int n = 0; n < numcomp; ++n) {
                t += xfab(i,j,k,xcomp+n) * yfab(i,j,k,ycomp+n);
            }
            return t;
        });
    } else
#endif
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (!system::regtest_reduction) reduction(+:sm)
#endif
        for (MFIter mfi(x,true); mfi.isValid(); ++mfi)
        {
            Box const& bx = mfi.growntilebox(nghost);
            Array4<Real const> const& xfab = x.const_array(mfi);
            Array4<Real const> const& yfab = y.const_array(mfi);
            AMREX_LOOP_4D(bx, numcomp, i, j, k, n,
            {
                sm += xfab(i,j,k,xcomp+n) * yfab(i,j,k,ycomp+n);
            });
        }
    }

    if (!local) {
        ParallelAllReduce::Sum(sm, ParallelContext::CommunicatorSub());
    }

    return sm;
}